

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarRemoveTab(ImGuiTabBar *tab_bar,ImGuiID tab_id)

{
  ImGuiTabItem *pIVar1;
  float in_ESI;
  ImGuiTabItem *in_RDI;
  ImGuiTabItem *tab;
  ImGuiTabBar *in_stack_ffffffffffffffe8;
  
  pIVar1 = TabBarFindTabByID(in_stack_ffffffffffffffe8,0);
  if (pIVar1 != (ImGuiTabItem *)0x0) {
    ImVector<ImGuiTabItem>::erase((ImVector<ImGuiTabItem> *)tab,in_RDI);
  }
  if (in_RDI->Offset == in_ESI) {
    in_RDI->Offset = 0.0;
  }
  if ((float)in_RDI->LastFrameSelected == in_ESI) {
    in_RDI->LastFrameSelected = 0;
  }
  if ((float)in_RDI->NameOffset == in_ESI) {
    in_RDI->NameOffset = 0;
  }
  return;
}

Assistant:

void ImGui::TabBarRemoveTab(ImGuiTabBar* tab_bar, ImGuiID tab_id)
{
    if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
        tab_bar->Tabs.erase(tab);
    if (tab_bar->VisibleTabId == tab_id)      { tab_bar->VisibleTabId = 0; }
    if (tab_bar->SelectedTabId == tab_id)     { tab_bar->SelectedTabId = 0; }
    if (tab_bar->NextSelectedTabId == tab_id) { tab_bar->NextSelectedTabId = 0; }
}